

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestSimpleChdir::Run(ParserTestSimpleChdir *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *this_00;
  Edge *this_01;
  VirtualFileSystem *fs;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  Edge *local_c0;
  Edge *edge;
  int local_98;
  allocator<char> local_91;
  int fail_count;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ParserTestSimpleChdir *local_10;
  ParserTestSimpleChdir *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"test-a",&local_31);
  VirtualFileSystem::MakeDir(&(this->super_ParserTest).fs_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"test-a/a.ninja",&local_69)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fail_count,
             "rule cat\n  command = cat $in > $out\nbuild out2: cat in1\nbuild out1: cat in2\nbuild final: cat out1\n"
             ,&local_91);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_68,(string *)&fail_count);
  std::__cxx11::string::~string((string *)&fail_count);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_98 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "subninja a.ninja\n    chdir = test-a\n\nrule pipe-through-test-a\n    command = $in | test-a/final > $out\n\nbuild foo: pipe-through-test-a | test-a/final\n\n"
            );
  iVar2 = local_98;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    ParserTest::VerifyCwd_abi_cxx11_((string *)&edge,(ParserTest *)&(this->super_ParserTest).fs_,fs)
    ;
    bVar3 = std::operator==("/",(string *)&edge);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
               ,0x4b0,"\"/\" == VerifyCwd(fs_)");
    std::__cxx11::string::~string((string *)&edge);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"test-a/final",&local_e1)
    ;
    this_00 = ParserTest::GetNode(&this->super_ParserTest,&local_e0);
    this_01 = Node::in_edge(this_00);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    pTVar1 = g_current_test;
    local_c0 = this_01;
    Edge::EvaluateCommand_abi_cxx11_(&local_108,this_01,false);
    bVar3 = std::operator==("cd \"test-a/\" && cat out1 > final",&local_108);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
               ,0x4b7,"\"cd \\\"test-a/\\\" && cat out1 > final\" == edge->EvaluateCommand()");
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, SimpleChdir) {
  fs_.MakeDir("test-a");
  fs_.Create("test-a/a.ninja",
    "rule cat\n"
    "  command = cat $in > $out\n"
    "build out2: cat in1\n"
    "build out1: cat in2\n"
    "build final: cat out1\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"subninja a.ninja\n"
"    chdir = test-a\n"
"\n"
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
  ));
  EXPECT_EQ("/", VerifyCwd(fs_));  // Verify cwd was restored

  // Verify edge command includes correct 'cd test-a'
  Edge* edge = GetNode("test-a/final")->in_edge();
#if _WIN32
  EXPECT_EQ("cmd /c cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#else
  EXPECT_EQ("cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#endif
}